

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O2

BasicMutSuffix<int> __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::FindOrCreateSuffix<int>
          (BasicProblem<mp::BasicProblemParams<int>_> *this,SuffixDef<int> *sufdef)

{
  int num_values;
  SuffixBase SVar1;
  BasicMutSuffix<int> BVar2;
  Kind kind;
  
  kind = sufdef->kind_ & PROBLEM;
  SVar1.impl_ = (Impl *)FindSuffix<int>(this,sufdef);
  num_values = GetSuffixSize(this,kind);
  if ((SuffixBase)SVar1.impl_ != (SuffixBase)0x0) {
    *(byte *)&(SVar1.impl_)->kind = (byte)(SVar1.impl_)->kind | 0x10;
    return (BasicSuffix<int>)(BasicSuffix<int>)SVar1.impl_;
  }
  BVar2 = BasicSuffixSet<std::allocator<char>_>::Add<int>
                    ((this->super_SuffixManager).suffixes_ + kind,sufdef->name_,sufdef->kind_ | 0x10
                     ,num_values,&sufdef->tab_);
  return (BasicMutSuffix<int>)BVar2.super_BasicSuffix<int>.super_SuffixBase.impl_;
}

Assistant:

BasicMutSuffix<T> FindOrCreateSuffix(const SuffixDef<T>& sufdef) {
    auto main_kind = (suf::Kind)(sufdef.kind() & suf::KIND_MASK);
    auto suf_raw = FindSuffix(sufdef);
    auto suf_size = GetSuffixSize(main_kind);    // can be < values.size()
    if (suf_raw) {
      suf_raw.or_kind(suf::OUTPUT);
      return suf_raw;
    }
    return suffixes(main_kind).template
            Add<T>(sufdef.name(), sufdef.kind() | suf::OUTPUT,
                   suf_size, sufdef.table());
  }